

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  char *pcVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>
  pvVar2;
  EnumValueDescriptor *pEVar3;
  EnumDescriptorProto *pEVar4;
  int i;
  int index;
  undefined8 *puVar5;
  FileDescriptor *local_68;
  LifetimesInfo local_60;
  
  if (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
    pcVar1 = (descriptor->all_names_).payload_;
    local_68 = descriptor->file_;
    local_60.full_name._M_len = (size_t)*(ushort *)(pcVar1 + 2);
    puVar5 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
    local_60.filename._M_str = (char *)*puVar5;
    local_60.filename._M_len = puVar5[1];
    local_60.full_name._M_str = pcVar1 + ~local_60.full_name._M_len;
    local_60.proto_features = descriptor->proto_features_;
    local_60.proto = &proto->super_Message;
    pvVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
             ::
             operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                         *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_68);
    std::
    vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
    ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
              (pvVar2,&local_60);
  }
  for (index = 0; index < descriptor->value_count_; index = index + 1) {
    pEVar3 = EnumDescriptor::value(descriptor,index);
    pEVar4 = (EnumDescriptorProto *)
             RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,index);
    if (pEVar3->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
      local_68 = pEVar3->type_->file_;
      local_60.full_name._M_str = pEVar3->all_names_[1]._M_dataplus._M_p;
      local_60.full_name._M_len = pEVar3->all_names_[1]._M_string_length;
      puVar5 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
      local_60.filename._M_str = (char *)*puVar5;
      local_60.filename._M_len = puVar5[1];
      local_60.proto_features = pEVar3->proto_features_;
      local_60.proto = (Message *)pEVar4;
      pvVar2 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
               ::
               operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                           *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_68);
      std::
      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
      ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                (pvVar2,&local_60);
    }
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }